

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<siginfo_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:327:30)>
::destroy(SimpleTransformPromiseNode<siginfo_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:327:30)>
          *this)

{
  SimpleTransformPromiseNode<siginfo_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:327:30)>
  *this_local;
  
  freePromise<kj::_::SimpleTransformPromiseNode<siginfo_t,kj::(anonymous_namespace)::TestCase317::run()::__0>>
            (this);
  return;
}

Assistant:

void destroy() override {
    freePromise(this);
  }